

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.c
# Opt level: O0

vec3 golf_config_get_vec3(golf_config_t *cfg,char *name)

{
  golf_config_property_t *pgVar1;
  vec3 vVar2;
  char *local_40;
  float local_38;
  golf_config_property_t *prop;
  char *name_local;
  golf_config_t *cfg_local;
  float local_c;
  
  pgVar1 = (golf_config_property_t *)map_get_((map_base_t *)cfg,name);
  (cfg->properties).ref = pgVar1;
  if ((pgVar1 == (golf_config_property_t *)0x0) || (pgVar1->type != GOLF_CONFIG_PROPERTY_VEC3)) {
    golf_log_warning("Invalid config property %s",name);
    vVar2 = vec3_create(0.0,0.0,0.0);
    local_40 = vVar2._0_8_;
    stack0xffffffffffffffec = local_40;
    local_38 = vVar2.z;
    local_c = local_38;
  }
  else {
    unique0x00012000 = (pgVar1->field_1).string_val;
    local_c = (pgVar1->field_1).vec3_val.z;
  }
  vVar2.z = local_c;
  vVar2._0_8_ = stack0xffffffffffffffec;
  return vVar2;
}

Assistant:

vec3 golf_config_get_vec3(golf_config_t *cfg, const char *name) {
    golf_config_property_t *prop = map_get(&cfg->properties, name);
    if (prop && prop->type == GOLF_CONFIG_PROPERTY_VEC3) {
        return prop->vec3_val;
    }
    else {
        golf_log_warning("Invalid config property %s", name);
        return V3(0, 0, 0);
    }
}